

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O1

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::KdTreeAggregate::Intersect
          (optional<pbrt::ShapeIntersection> *__return_storage_ptr__,KdTreeAggregate *this,Ray *ray,
          Float rayTMax)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  int iVar12;
  ulong uVar13;
  Ray *pRVar14;
  uint uVar15;
  KdTreeNode *pKVar16;
  Point3<float> *pPVar17;
  KdTreeNode *pKVar18;
  KdTreeNode *pKVar19;
  Ray *pRVar20;
  Vector3f *pVVar21;
  uint uVar22;
  Bounds3f *pBVar23;
  int iVar24;
  long lVar25;
  long in_FS_OFFSET;
  bool bVar26;
  float fVar27;
  undefined1 auVar28 [64];
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  optional<pbrt::ShapeIntersection> primSi;
  KdNodeToVisit toVisit [64];
  byte local_5a5;
  Float local_5a4;
  float local_5a0;
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_540;
  char local_440;
  long lStack_438;
  float afStack_430 [256];
  
  pfVar1 = &(ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  pfVar2 = &(ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
  pfVar3 = &(ray->o).super_Tuple3<pbrt::Point3,_float>.y;
  pfVar4 = &(ray->o).super_Tuple3<pbrt::Point3,_float>.z;
  local_5a0 = 0.0;
  bVar26 = false;
  uVar22 = 0;
  local_5a4 = rayTMax;
  do {
    pVVar21 = &ray->d;
    if ((uVar22 != 0) && (pVVar21 = (Vector3f *)pfVar1, uVar22 != 1)) {
      pVVar21 = (Vector3f *)pfVar2;
    }
    pBVar23 = &this->bounds;
    if ((uVar22 != 0) &&
       (pBVar23 = (Bounds3f *)&(this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y, uVar22 != 1)
       ) {
      pBVar23 = (Bounds3f *)&(this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
    }
    pRVar14 = ray;
    if ((uVar22 != 0) && (pRVar14 = (Ray *)pfVar3, uVar22 != 1)) {
      pRVar14 = (Ray *)pfVar4;
    }
    pPVar17 = &(this->bounds).pMax;
    if ((uVar22 != 0) &&
       (pPVar17 = (Point3<float> *)&(this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y,
       uVar22 != 1)) {
      pPVar17 = (Point3<float> *)&(this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
    }
    pRVar20 = ray;
    if ((uVar22 != 0) && (pRVar20 = (Ray *)pfVar3, uVar22 != 1)) {
      pRVar20 = (Ray *)pfVar4;
    }
    fVar29 = 1.0 / (pVVar21->super_Tuple3<pbrt::Vector3,_float>).x;
    auVar30 = ZEXT416((uint)(fVar29 * ((pPVar17->super_Tuple3<pbrt::Point3,_float>).x -
                                      (pRVar20->o).super_Tuple3<pbrt::Point3,_float>.x)));
    auVar31 = ZEXT416((uint)(fVar29 * ((pBVar23->pMin).super_Tuple3<pbrt::Point3,_float>.x -
                                      (pRVar14->o).super_Tuple3<pbrt::Point3,_float>.x)));
    auVar11 = vminss_avx(auVar30,auVar31);
    auVar11 = vmaxss_avx(auVar11,ZEXT416((uint)local_5a0));
    auVar30 = vmaxss_avx(auVar31,auVar30);
    auVar30 = vminss_avx(ZEXT416((uint)(auVar30._0_4_ * 1.0000004)),ZEXT416((uint)local_5a4));
    local_5a0 = auVar11._0_4_;
    local_5a4 = auVar30._0_4_;
    if (local_5a4 < local_5a0) break;
    bVar26 = 1 < uVar22;
    uVar22 = uVar22 + 1;
  } while (uVar22 != 3);
  if (!bVar26) {
    auVar28 = ZEXT1264(ZEXT812(0));
    *(undefined1 (*) [64])((long)&__return_storage_ptr__->optionalValue + 0xc0) = auVar28;
    *(undefined1 (*) [64])((long)&__return_storage_ptr__->optionalValue + 0x80) = auVar28;
    *(undefined1 (*) [64])((long)&__return_storage_ptr__->optionalValue + 0x40) = auVar28;
    *(undefined1 (*) [64])&__return_storage_ptr__->optionalValue = auVar28;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    return __return_storage_ptr__;
  }
  fVar29 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar7 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar8 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
  __return_storage_ptr__->set = false;
  pKVar19 = this->nodes;
  uVar13 = 0;
  if ((pKVar19 != (KdTreeNode *)0x0) && (local_5a0 <= rayTMax)) {
    local_5a5 = __return_storage_ptr__->set;
    puVar5 = (undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50);
    puVar6 = (undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0);
    uVar13 = 0;
    uVar22 = 0;
    do {
      uVar22 = uVar22 + 1;
      uVar15 = (pKVar19->field_1).flags & 3;
      iVar12 = (pKVar19->field_1).flags >> 2;
      iVar24 = (int)uVar13;
      if (uVar15 == 3) {
        if (iVar12 == 1) {
          PrimitiveHandle::Intersect
                    ((optional<pbrt::ShapeIntersection> *)&local_540.__align,
                     (this->primitives).
                     super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                     ._M_impl.super__Vector_impl_data._M_start + (pKVar19->field_0).onePrimitive,ray
                     ,rayTMax);
          if (local_440 == '\x01') {
            if ((local_5a5 & 1) != 0) {
              __return_storage_ptr__->set = false;
            }
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = local_540._64_8_;
            (__return_storage_ptr__->optionalValue).__align = local_540.__align;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = local_540._8_8_;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = local_540._16_8_;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = local_540._24_8_;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = local_540._32_8_;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = local_540._40_8_;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = local_540._48_8_;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = local_540._56_8_;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = local_540._72_8_;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = local_540._128_8_
            ;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = local_540._136_8_
            ;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = local_540._144_8_
            ;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = local_540._152_8_
            ;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = local_540._160_8_
            ;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = local_540._168_8_
            ;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = local_540._176_8_
            ;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = local_540._184_8_
            ;
            *puVar5 = local_540._80_8_;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = local_540._88_8_;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = local_540._96_8_;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = local_540._104_8_
            ;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = local_540._112_8_
            ;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = local_540._120_8_
            ;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = local_540._128_8_
            ;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = local_540._136_8_
            ;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = 0;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200) = 0;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = local_540._192_8_
            ;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200) = local_540._200_8_;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = local_540._240_8_
            ;
            *puVar6 = local_540._208_8_;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) = local_540._216_8_
            ;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) = local_540._224_8_
            ;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = local_540._232_8_
            ;
            *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) = local_540._248_4_
            ;
            __return_storage_ptr__->set = true;
            local_5a5 = 1;
            rayTMax = (Float)local_540._248_4_;
          }
          if (local_440 != '\0') {
            local_440 = '\0';
          }
        }
        else if (0 < iVar12) {
          lVar25 = 0;
          do {
            PrimitiveHandle::Intersect
                      ((optional<pbrt::ShapeIntersection> *)&local_540.__align,
                       (this->primitives).
                       super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                       (this->primitiveIndices).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start
                       [(pKVar19->field_0).onePrimitive + lVar25],ray,rayTMax);
            if (local_440 == '\x01') {
              if ((local_5a5 & 1) != 0) {
                __return_storage_ptr__->set = false;
              }
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) =
                   local_540._64_8_;
              (__return_storage_ptr__->optionalValue).__align = local_540.__align;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = local_540._8_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) =
                   local_540._16_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
                   local_540._24_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) =
                   local_540._32_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) =
                   local_540._40_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
                   local_540._48_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) =
                   local_540._56_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) =
                   local_540._72_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) =
                   local_540._128_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) =
                   local_540._136_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) =
                   local_540._144_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) =
                   local_540._152_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) =
                   local_540._160_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) =
                   local_540._168_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) =
                   local_540._176_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) =
                   local_540._184_8_;
              *puVar5 = local_540._80_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) =
                   local_540._88_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) =
                   local_540._96_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) =
                   local_540._104_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) =
                   local_540._112_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) =
                   local_540._120_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) =
                   local_540._128_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) =
                   local_540._136_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = 0;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200) = 0;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) =
                   local_540._192_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200) =
                   local_540._200_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) =
                   local_540._240_8_;
              *puVar6 = local_540._208_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) =
                   local_540._216_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) =
                   local_540._224_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) =
                   local_540._232_8_;
              *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) =
                   local_540._248_4_;
              __return_storage_ptr__->set = true;
              local_5a5 = 1;
              rayTMax = (Float)local_540._248_4_;
            }
            if (local_440 != '\0') {
              local_440 = '\0';
            }
            lVar25 = lVar25 + 1;
          } while (iVar12 != (int)lVar25);
        }
        if (iVar24 < 1) goto LAB_003b69a2;
        uVar13 = (ulong)(iVar24 - 1);
        local_5a0 = afStack_430[uVar13 * 4];
        pKVar19 = (KdTreeNode *)(&lStack_438)[uVar13 * 2];
        local_5a4 = afStack_430[uVar13 * 4 + 1];
      }
      else {
        pRVar14 = ray;
        if ((uVar15 != 0) && (pRVar14 = (Ray *)pfVar3, uVar15 != 1)) {
          pRVar14 = (Ray *)pfVar4;
        }
        fVar27 = fVar29;
        if ((uVar15 != 0) && (fVar27 = fVar7, uVar15 != 1)) {
          fVar27 = fVar8;
        }
        pRVar20 = ray;
        if ((uVar15 != 0) && (pRVar20 = (Ray *)pfVar3, uVar15 != 1)) {
          pRVar20 = (Ray *)pfVar4;
        }
        fVar9 = (pKVar19->field_0).split;
        if ((pRVar20->o).super_Tuple3<pbrt::Point3,_float>.x < fVar9) {
LAB_003b6774:
          pKVar18 = pKVar19 + 1;
          pKVar16 = this->nodes + iVar12;
        }
        else {
          pRVar20 = ray;
          if ((uVar15 != 0) && (pRVar20 = (Ray *)pfVar3, uVar15 != 1)) {
            pRVar20 = (Ray *)pfVar4;
          }
          fVar10 = (pRVar20->o).super_Tuple3<pbrt::Point3,_float>.x;
          if ((fVar10 == fVar9) && (!NAN(fVar10) && !NAN(fVar9))) {
            pVVar21 = &ray->d;
            if ((uVar15 != 0) && (pVVar21 = (Vector3f *)pfVar1, uVar15 != 1)) {
              pVVar21 = (Vector3f *)pfVar2;
            }
            if ((pVVar21->super_Tuple3<pbrt::Vector3,_float>).x <= 0.0) goto LAB_003b6774;
          }
          pKVar18 = this->nodes + iVar12;
          pKVar16 = pKVar19 + 1;
        }
        fVar27 = (fVar9 - (pRVar14->o).super_Tuple3<pbrt::Point3,_float>.x) * (1.0 / fVar27);
        pKVar19 = pKVar18;
        if (((fVar27 <= local_5a4) && (0.0 < fVar27)) && (pKVar19 = pKVar16, local_5a0 <= fVar27)) {
          lVar25 = (long)iVar24;
          (&lStack_438)[lVar25 * 2] = (long)pKVar16;
          afStack_430[lVar25 * 4] = fVar27;
          afStack_430[lVar25 * 4 + 1] = local_5a4;
          uVar13 = (ulong)(iVar24 + 1);
          pKVar19 = pKVar18;
          local_5a4 = fVar27;
        }
      }
      if ((pKVar19 == (KdTreeNode *)0x0) || (rayTMax < local_5a0)) goto LAB_003b69a2;
    } while( true );
  }
LAB_003b69a5:
  *(long *)(in_FS_OFFSET + -0x308) = *(long *)(in_FS_OFFSET + -0x308) + uVar13;
  return __return_storage_ptr__;
LAB_003b69a2:
  uVar13 = (ulong)uVar22;
  goto LAB_003b69a5;
}

Assistant:

pstd::optional<ShapeIntersection> KdTreeAggregate::Intersect(const Ray &ray,
                                                             Float rayTMax) const {
    // Compute initial parametric range of ray inside kd-tree extent
    Float tMin, tMax;
    if (!bounds.IntersectP(ray.o, ray.d, rayTMax, &tMin, &tMax))
        return {};

    // Prepare to traverse kd-tree for ray
    Vector3f invDir(1 / ray.d.x, 1 / ray.d.y, 1 / ray.d.z);
    constexpr int maxToVisit = 64;
    KdNodeToVisit toVisit[maxToVisit];
    int toVisitIndex = 0;
    int nodesVisited = 0;

    // Traverse kd-tree nodes in order for ray
    pstd::optional<ShapeIntersection> si;
    const KdTreeNode *node = &nodes[0];
    while (node != nullptr) {
        // Bail out if we found a hit closer than the current node
        if (rayTMax < tMin)
            break;

        ++nodesVisited;
        if (!node->IsLeaf()) {
            // Visit kd-tree interior node
            // Compute parametric distance along ray to split plane
            int axis = node->SplitAxis();
            Float tSplit = (node->SplitPos() - ray.o[axis]) * invDir[axis];

            // Get node children pointers for ray
            const KdTreeNode *firstChild, *secondChild;
            int belowFirst = (ray.o[axis] < node->SplitPos()) ||
                             (ray.o[axis] == node->SplitPos() && ray.d[axis] <= 0);
            if (belowFirst) {
                firstChild = node + 1;
                secondChild = &nodes[node->AboveChild()];
            } else {
                firstChild = &nodes[node->AboveChild()];
                secondChild = node + 1;
            }

            // Advance to next child node, possibly enqueue other child
            if (tSplit > tMax || tSplit <= 0)
                node = firstChild;
            else if (tSplit < tMin)
                node = secondChild;
            else {
                // Enqueue _secondChild_ in todo list
                toVisit[toVisitIndex].node = secondChild;
                toVisit[toVisitIndex].tMin = tSplit;
                toVisit[toVisitIndex].tMax = tMax;
                ++toVisitIndex;

                node = firstChild;
                tMax = tSplit;
            }

        } else {
            // Check for intersections inside leaf node
            int nPrimitives = node->nPrimitives();
            if (nPrimitives == 1) {
                const PrimitiveHandle &p = primitives[node->onePrimitive];
                // Check one primitive inside leaf node
                pstd::optional<ShapeIntersection> primSi = p.Intersect(ray, rayTMax);
                if (primSi) {
                    si = primSi;
                    rayTMax = si->tHit;
                }

            } else {
                for (int i = 0; i < nPrimitives; ++i) {
                    int index = primitiveIndices[node->primitiveIndicesOffset + i];
                    const PrimitiveHandle &p = primitives[index];
                    // Check one primitive inside leaf node
                    pstd::optional<ShapeIntersection> primSi = p.Intersect(ray, rayTMax);
                    if (primSi) {
                        si = primSi;
                        rayTMax = si->tHit;
                    }
                }
            }

            // Grab next node to visit from todo list
            if (toVisitIndex > 0) {
                --toVisitIndex;
                node = toVisit[toVisitIndex].node;
                tMin = toVisit[toVisitIndex].tMin;
                tMax = toVisit[toVisitIndex].tMax;
            } else
                break;
        }
    }
    kdNodesVisited += nodesVisited;
    return si;
}